

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

uint GetFunctionVmReturnType
               (ExternFuncInfo *function,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  uint uVar1;
  SubCategory SVar2;
  ulong uVar3;
  
  uVar3 = (ulong)exTypeExtra[exTypes[function->funcType].field_11.subType].type;
  if ((uVar3 < 0xf) &&
     ((0x47ffU >> (exTypeExtra[exTypes[function->funcType].field_11.subType].type & 0x1f) & 1) != 0)
     ) {
    SVar2 = *(SubCategory *)(&DAT_0032a4dc + uVar3 * 4);
  }
  else {
    SVar2 = exTypes[uVar3].subCat;
    if (SVar2 != CAT_POINTER) {
      if ((SVar2 == CAT_CLASS) && (exTypes[uVar3].type == TYPE_INT)) {
        uVar1 = 3;
      }
      else {
        uVar1 = 4;
      }
      return uVar1;
    }
  }
  return SVar2;
}

Assistant:

unsigned GetFunctionVmReturnType(ExternFuncInfo &function, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	RegVmReturnType retType = rvrVoid;

	ExternTypeInfo &targetType = exTypes[function.funcType];

	unsigned targetReturnTypeId = exTypeExtra[targetType.memberOffset].type;
	ExternTypeInfo &targetReturnType = exTypes[targetReturnTypeId];

	switch(targetReturnTypeId)
	{
	case NULLC_TYPE_VOID:
		retType = rvrVoid;
		break;
	case NULLC_TYPE_BOOL:
	case NULLC_TYPE_CHAR:
	case NULLC_TYPE_SHORT:
	case NULLC_TYPE_INT:
		retType = rvrInt;
		break;
	case NULLC_TYPE_LONG:
		retType = rvrLong;
		break;
	case NULLC_TYPE_FLOAT:
	case NULLC_TYPE_DOUBLE:
		retType = rvrDouble;
		break;
	case NULLC_TYPE_TYPEID:
	case NULLC_TYPE_FUNCTION:
		retType = rvrInt;
		break;
	case NULLC_TYPE_NULLPTR:
	case NULLC_TYPE_VOID_REF:
		retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		break;
	default:
		if(targetReturnType.subCat == ExternTypeInfo::CAT_POINTER)
			retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		else if(targetReturnType.subCat == ExternTypeInfo::CAT_CLASS && targetReturnType.type == ExternTypeInfo::TYPE_INT)
			retType = rvrInt;
		else
			retType = rvrStruct;
		break;
	}

	return retType;
}